

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O2

void __thiscall rlottie::internal::renderer::Group::applyTrim(Group *this)

{
  Trim *this_00;
  uint uVar1;
  __normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>
  __tmp;
  pointer ppOVar2;
  
  ppOVar2 = (this->mContents).
            super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  while (ppOVar2 !=
         (this->mContents).
         super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
         ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = (Trim *)ppOVar2[-1];
    ppOVar2 = ppOVar2 + -1;
    uVar1 = (*(this_00->super_Object)._vptr_Object[5])(this_00);
    if ((char)uVar1 == '\x01') {
      applyTrim((Group *)this_00);
    }
    else if ((uVar1 & 0xff) == 4) {
      Trim::update(this_00);
    }
  }
  return;
}

Assistant:

void renderer::Group::applyTrim()
{
    for (auto i = mContents.rbegin(); i != mContents.rend(); ++i) {
        auto content = (*i);
        switch (content->type()) {
        case renderer::Object::Type::Trim: {
            static_cast<renderer::Trim *>(content)->update();
            break;
        }
        case renderer::Object::Type::Group: {
            static_cast<renderer::Group *>(content)->applyTrim();
            break;
        }
        default:
            break;
        }
    }
}